

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdfx.c
# Opt level: O0

char * gdImageStringFTCircle
                 (gdImagePtr im,int cx,int cy,double radius,double textRadius,double fillPortion,
                 char *font,double points,char *top,char *bottom,int fgcolor)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  gdImagePtr im_00;
  gdImagePtr dst;
  gdImagePtr im_01;
  double dVar5;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d0;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  int local_19c;
  int local_194;
  int local_190;
  int local_18c;
  int local_188;
  int local_180;
  int local_17c;
  int local_178;
  int local_174;
  int local_170;
  int local_168;
  int local_160;
  int local_15c;
  int local_158;
  int local_154;
  int local_14c;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  int local_134;
  int local_12c;
  int local_128;
  int local_124;
  int local_120;
  int local_118;
  int a;
  int oy_2;
  int ox_2;
  int t_1;
  int xlimit_1;
  int oy_1;
  int ox_1;
  int t;
  int xlimit;
  gdImagePtr im3;
  gdImagePtr im2;
  gdImagePtr im1;
  double prop;
  int oy;
  int ox;
  int fa;
  int fb;
  int fg;
  int fr;
  int y;
  int x;
  int sy;
  int sx;
  int sy2;
  int sy1;
  int sx2;
  int sx1;
  int brect [8];
  int local_6c;
  int w;
  char *err;
  char *bottom_local;
  char *top_local;
  double points_local;
  char *font_local;
  double fillPortion_local;
  double textRadius_local;
  double radius_local;
  int cy_local;
  int cx_local;
  gdImagePtr im_local;
  
  im_local = (gdImagePtr)gdImageStringFT((gdImage *)0x0,&sx2,0,font,points * 4.0,0.0,0,0,bottom);
  if (im_local == (gdImagePtr)0x0) {
    if (brect[0] < sx2) {
      local_118 = sx2;
    }
    else {
      local_118 = brect[0];
    }
    if (brect[4] < brect[2]) {
      local_120 = brect[2];
    }
    else {
      local_120 = brect[4];
    }
    if (local_120 < local_118) {
      if (brect[0] < sx2) {
        local_124 = sx2;
      }
      else {
        local_124 = brect[0];
      }
      local_128 = local_124;
    }
    else {
      if (brect[4] < brect[2]) {
        local_12c = brect[2];
      }
      else {
        local_12c = brect[4];
      }
      local_128 = local_12c;
    }
    if (sx2 < brect[0]) {
      local_134 = sx2;
    }
    else {
      local_134 = brect[0];
    }
    if (brect[2] < brect[4]) {
      local_13c = brect[2];
    }
    else {
      local_13c = brect[4];
    }
    if (local_134 < local_13c) {
      if (sx2 < brect[0]) {
        local_140 = sx2;
      }
      else {
        local_140 = brect[0];
      }
      local_144 = local_140;
    }
    else {
      if (brect[2] < brect[4]) {
        local_148 = brect[2];
      }
      else {
        local_148 = brect[4];
      }
      local_144 = local_148;
    }
    iVar1 = (local_128 - local_144) + 6;
    if (brect[1] < sx1) {
      local_14c = sx1;
    }
    else {
      local_14c = brect[1];
    }
    if (brect[5] < brect[3]) {
      local_154 = brect[3];
    }
    else {
      local_154 = brect[5];
    }
    if (local_154 < local_14c) {
      if (brect[1] < sx1) {
        local_158 = sx1;
      }
      else {
        local_158 = brect[1];
      }
      local_15c = local_158;
    }
    else {
      if (brect[5] < brect[3]) {
        local_160 = brect[3];
      }
      else {
        local_160 = brect[5];
      }
      local_15c = local_160;
    }
    if (sx1 < brect[1]) {
      local_168 = sx1;
    }
    else {
      local_168 = brect[1];
    }
    if (brect[3] < brect[5]) {
      local_170 = brect[3];
    }
    else {
      local_170 = brect[5];
    }
    if (local_168 < local_170) {
      if (sx1 < brect[1]) {
        local_174 = sx1;
      }
      else {
        local_174 = brect[1];
      }
      local_178 = local_174;
    }
    else {
      if (brect[3] < brect[5]) {
        local_17c = brect[3];
      }
      else {
        local_17c = brect[5];
      }
      local_178 = local_17c;
    }
    iVar2 = (local_15c - local_178) + 6;
    im_local = (gdImagePtr)gdImageStringFT((gdImage *)0x0,&sx2,0,font,points * 4.0,0.0,0,0,top);
    if (im_local == (gdImagePtr)0x0) {
      if (brect[0] < sx2) {
        local_180 = sx2;
      }
      else {
        local_180 = brect[0];
      }
      if (brect[4] < brect[2]) {
        local_188 = brect[2];
      }
      else {
        local_188 = brect[4];
      }
      if (local_188 < local_180) {
        if (brect[0] < sx2) {
          local_18c = sx2;
        }
        else {
          local_18c = brect[0];
        }
        local_190 = local_18c;
      }
      else {
        if (brect[4] < brect[2]) {
          local_194 = brect[2];
        }
        else {
          local_194 = brect[4];
        }
        local_190 = local_194;
      }
      if (sx2 < brect[0]) {
        local_19c = sx2;
      }
      else {
        local_19c = brect[0];
      }
      if (brect[2] < brect[4]) {
        local_1a4 = brect[2];
      }
      else {
        local_1a4 = brect[4];
      }
      if (local_19c < local_1a4) {
        if (sx2 < brect[0]) {
          local_1a8 = sx2;
        }
        else {
          local_1a8 = brect[0];
        }
        local_1ac = local_1a8;
      }
      else {
        if (brect[2] < brect[4]) {
          local_1b0 = brect[2];
        }
        else {
          local_1b0 = brect[4];
        }
        local_1ac = local_1b0;
      }
      iVar3 = (local_190 - local_1ac) + 6;
      if (brect[1] < sx1) {
        local_1b4 = sx1;
      }
      else {
        local_1b4 = brect[1];
      }
      if (brect[5] < brect[3]) {
        local_1bc = brect[3];
      }
      else {
        local_1bc = brect[5];
      }
      if (local_1bc < local_1b4) {
        if (brect[1] < sx1) {
          local_1c0 = sx1;
        }
        else {
          local_1c0 = brect[1];
        }
        local_1c4 = local_1c0;
      }
      else {
        if (brect[5] < brect[3]) {
          local_1c8 = brect[3];
        }
        else {
          local_1c8 = brect[5];
        }
        local_1c4 = local_1c8;
      }
      if (sx1 < brect[1]) {
        local_1d0 = sx1;
      }
      else {
        local_1d0 = brect[1];
      }
      if (brect[3] < brect[5]) {
        local_1d8 = brect[3];
      }
      else {
        local_1d8 = brect[5];
      }
      if (local_1d0 < local_1d8) {
        if (sx1 < brect[1]) {
          local_1dc = sx1;
        }
        else {
          local_1dc = brect[1];
        }
        local_1e0 = local_1dc;
      }
      else {
        if (brect[3] < brect[5]) {
          local_1e4 = brect[3];
        }
        else {
          local_1e4 = brect[5];
        }
        local_1e0 = local_1e4;
      }
      y = (local_1c4 - local_1e0) + 6;
      iVar4 = iVar3;
      if (iVar3 < iVar1) {
        iVar4 = iVar1;
      }
      iVar4 = iVar4 * 2;
      x = iVar4 + 4;
      if (y < iVar2) {
        y = iVar2;
      }
      im_00 = gdImageCreateTrueColor(x,y);
      if (im_00 == (gdImagePtr)0x0) {
        im_local = (gdImagePtr)anon_var_dwarf_3015;
      }
      else {
        im_local = (gdImagePtr)
                   gdImageStringFT(im_00,(int *)0x0,0xffffff,font,points * 4.0,0.0,
                                   (x / 2 - iVar1) / 2,(int)(points * 4.0),bottom);
        if (im_local == (gdImagePtr)0x0) {
          im_local = (gdImagePtr)
                     gdImageStringFT(im_00,(int *)0x0,0xffffff,font,points * 4.0,0.0,
                                     x / 2 + (x / 2 - iVar3) / 2,(int)(points * 4.0),top);
          if (im_local == (gdImagePtr)0x0) {
            if ((y & 1U) == 0) {
              for (fg = 0; fg < y / 2; fg = fg + 1) {
                for (fr = x / 2 + 2; fr < iVar4 + 2; fr = fr + 1) {
                  iVar2 = (x - fr) + x / 2 + -1;
                  iVar3 = (y - fg) + -1;
                  iVar1 = im_00->tpixels[iVar3][iVar2];
                  im_00->tpixels[iVar3][iVar2] = im_00->tpixels[fg][fr];
                  im_00->tpixels[fg][fr] = iVar1;
                }
              }
            }
            else {
              for (fg = 0; fg <= y / 2; fg = fg + 1) {
                ox_1 = iVar4 + 2;
                if (fg == y / 2) {
                  ox_1 = ox_1 - x / 4;
                }
                for (fr = x / 2 + 2; fr < ox_1; fr = fr + 1) {
                  iVar2 = (x - fr) + x / 2 + -1;
                  iVar3 = (y - fg) + -1;
                  iVar1 = im_00->tpixels[iVar3][iVar2];
                  im_00->tpixels[iVar3][iVar2] = im_00->tpixels[fg][fr];
                  im_00->tpixels[fg][fr] = iVar1;
                }
              }
            }
            if (x == y * 10 || SBORROW4(x,y * 10) != x + y * -10 < 0) {
              local_6c = y * 10;
            }
            else {
              local_6c = x;
            }
            dst = gdImageCreateTrueColor(local_6c,local_6c);
            if (dst == (gdImagePtr)0x0) {
              gdImageDestroy(im_00);
              im_local = (gdImagePtr)anon_var_dwarf_3033;
            }
            else {
              dVar5 = textRadius / radius;
              gdImageCopyResampled
                        (dst,im_00,(int)(((double)dst->sx * (1.0 - fillPortion)) / 4.0),
                         (int)((double)(y * 10) * (1.0 - dVar5)),0,0,
                         (int)(((double)dst->sx * fillPortion) / 2.0),
                         (int)((double)(y * 10) * dVar5),im_00->sx / 2,im_00->sy);
              gdImageCopyResampled
                        (dst,im_00,
                         (int)((double)(dst->sx / 2) + ((double)dst->sx * (1.0 - fillPortion)) / 4.0
                              ),(int)((double)(y * 10) * (1.0 - dVar5)),im_00->sx / 2,0,
                         (int)(((double)dst->sx * fillPortion) / 2.0),
                         (int)((double)(y * 10) * dVar5),im_00->sx / 2,im_00->sy);
              im_01 = gdImageSquareToCircle(dst,(int)radius);
              gdImageDestroy(im_00);
              gdImageDestroy(dst);
              iVar1 = im_01->sx;
              iVar2 = im_01->sy;
              for (fg = 0; fg < im_01->sy; fg = fg + 1) {
                for (fr = 0; fr < im_01->sx; fr = fr + 1) {
                  gdImageSetPixel(im,fr + (cx - iVar1 / 2),fg + (cy - iVar2 / 2),
                                  (0x7f - ((0x7f - ((int)(fgcolor & 0x7f000000U) >> 0x18)) *
                                          ((int)(im_01->tpixels[fg][fr] & 0xff0000U) >> 0x11)) /
                                          0x7f) * 0x1000000 +
                                  ((int)(fgcolor & 0xff0000U) >> 0x10) * 0x10000 +
                                  ((int)(fgcolor & 0xff00U) >> 8) * 0x100 + (fgcolor & 0xffU));
                }
              }
              gdImageDestroy(im_01);
              im_local = (gdImagePtr)0x0;
            }
          }
          else {
            gdImageDestroy(im_00);
          }
        }
        else {
          gdImageDestroy(im_00);
        }
      }
    }
  }
  return (char *)im_local;
}

Assistant:

BGD_DECLARE(char *)
gdImageStringFTCircle (gdImagePtr im,
                       int cx,
                       int cy,
                       double radius,
                       double textRadius,
                       double fillPortion,
                       char *font,
                       double points, char *top, char *bottom, int fgcolor)
{
	char *err;
	int w;
	int brect[8];
	int sx1, sx2, sy1, sy2, sx, sy;
	int x, y;
	int fr, fg, fb, fa;
	int ox, oy;
	double prop;
	gdImagePtr im1;
	gdImagePtr im2;
	gdImagePtr im3;
	/* obtain brect so that we can size the image */
	err = gdImageStringFT ((gdImagePtr) NULL,
	                       &brect[0], 0, font, points * MAG, 0, 0, 0, bottom);
	if (err) {
		return err;
	}
	sx1 = MAXX (brect) - MINX (brect) + 6;
	sy1 = MAXY (brect) - MINY (brect) + 6;
	err = gdImageStringFT ((gdImagePtr) NULL,
	                       &brect[0], 0, font, points * MAG, 0, 0, 0, top);
	if (err) {
		return err;
	}
	sx2 = MAXX (brect) - MINX (brect) + 6;
	sy2 = MAXY (brect) - MINY (brect) + 6;
	/* Pad by 4 pixels to allow for slight errors
	   observed in the bounding box returned by freetype */
	if (sx1 > sx2) {
		sx = sx1 * 2 + 4;
	} else {
		sx = sx2 * 2 + 4;
	}
	if (sy1 > sy2) {
		sy = sy1;
	} else {
		sy = sy2;
	}
	im1 = gdImageCreateTrueColor (sx, sy);
	if (!im1) {
		return "could not create first image";
	}
	err = gdImageStringFT (im1, 0, gdTrueColor (255, 255, 255),
	                       font, points * MAG,
	                       0, ((sx / 2) - sx1) / 2, points * MAG, bottom);
	if (err) {
		gdImageDestroy (im1);
		return err;
	}
	/* We don't know the descent, which would be needed to do this
	   with the angle parameter. Instead, implement a simple
	   flip operation ourselves. */
	err = gdImageStringFT (im1, 0, gdTrueColor (255, 255, 255),
	                       font, points * MAG,
	                       0, sx / 2 + ((sx / 2) - sx2) / 2, points * MAG, top);
	if (err) {
		gdImageDestroy (im1);
		return err;
	}
	/* Flip in place is tricky, be careful not to double-swap things */
	if (sy & 1) {
		for (y = 0; (y <= (sy / 2)); y++) {
			int xlimit = sx - 2;
			if (y == (sy / 2)) {
				/* If there is a "middle" row, be careful
				   not to swap twice! */
				xlimit -= (sx / 4);
			}
			for (x = (sx / 2) + 2; (x < xlimit); x++) {
				int t;
				int ox = sx - x + (sx / 2) - 1;
				int oy = sy - y - 1;
				t = im1->tpixels[oy][ox];
				im1->tpixels[oy][ox] = im1->tpixels[y][x];
				im1->tpixels[y][x] = t;
			}
		}
	} else {
		for (y = 0; (y < (sy / 2)); y++) {
			int xlimit = sx - 2;
			for (x = (sx / 2) + 2; (x < xlimit); x++) {
				int t;
				int ox = sx - x + (sx / 2) - 1;
				int oy = sy - y - 1;
				t = im1->tpixels[oy][ox];
				im1->tpixels[oy][ox] = im1->tpixels[y][x];
				im1->tpixels[y][x] = t;
			}
		}
	}
#if STEP_PNGS
	{
		FILE *out = fopen ("gdfx1.png", "wb");
		gdImagePng (im1, out);
		fclose (out);
	}
#endif /* STEP_PNGS */
	/* Resample taller; the exact proportions of the text depend on the
	   ratio of textRadius to radius, and the value of fillPortion */
	if (sx > sy * 10) {
		w = sx;
	} else {
		w = sy * 10;
	}
	im2 = gdImageCreateTrueColor (w, w);
	if (!im2) {
		gdImageDestroy (im1);
		return "could not create resampled image";
	}
	prop = textRadius / radius;
	gdImageCopyResampled (im2, im1,
	                      gdImageSX (im2) * (1.0 - fillPortion) / 4,
	                      sy * 10 * (1.0 - prop),
	                      0, 0,
	                      gdImageSX (im2) * fillPortion / 2, sy * 10 * prop,
	                      gdImageSX (im1) / 2, gdImageSY (im1));
	gdImageCopyResampled (im2, im1,
	                      (gdImageSX (im2) / 2) +
	                      gdImageSX (im2) * (1.0 - fillPortion) / 4,
	                      sy * 10 * (1.0 - prop),
	                      gdImageSX (im1) / 2, 0,
	                      gdImageSX (im2) * fillPortion / 2, sy * 10 * prop,
	                      gdImageSX (im1) / 2, gdImageSY (im1));
#if STEP_PNGS
	{
		FILE *out = fopen ("gdfx2.png", "wb");
		gdImagePng (im2, out);
		fclose (out);
	}
#endif /* STEP_PNGS */
	/* Ready to produce a circle */
	im3 = gdImageSquareToCircle (im2, radius);
	gdImageDestroy (im1);
	gdImageDestroy (im2);
	/* Now blend im3 with the destination. Cheat a little. The
	   source (im3) is white-on-black, so we can use the
	   red component as a basis for alpha as long as we're
	   careful to shift off the extra bit and invert
	   (alpha ranges from 0 to 127 where 0 is OPAQUE).
	   Also be careful to allow for an alpha component
	   in the fgcolor parameter itself (gug!) */
	fr = gdTrueColorGetRed (fgcolor);
	fg = gdTrueColorGetGreen (fgcolor);
	fb = gdTrueColorGetBlue (fgcolor);
	fa = gdTrueColorGetAlpha (fgcolor);
	ox = cx - (im3->sx / 2);
	oy = cy - (im3->sy / 2);
	for (y = 0; (y < im3->sy); y++) {
		for (x = 0; (x < im3->sx); x++) {
			int a = gdTrueColorGetRed (im3->tpixels[y][x]) >> 1;
			a *= (127 - fa);
			a /= 127;
			a = 127 - a;
			gdImageSetPixel (im, x + ox, y + oy,
			                 gdTrueColorAlpha (fr, fg, fb, a));
		}
	}
	gdImageDestroy (im3);
	return 0;
}